

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svc_datarate_test.cc
# Opt level: O0

void __thiscall
datarate_test::anon_unknown_0::DatarateTestSVC::BasicRateTargetingSVC3TL3SLSimulcast
          (DatarateTestSVC *this)

{
  bool bVar1;
  uint uVar2;
  __tuple_element_t<4UL,_tuple<const_CodecFactory_*,_TestMode,_int,_unsigned_int,_int>_> *p_Var3;
  char *message;
  DatarateTestSVC *in_RDI;
  AssertionResult gtest_ar_2;
  int num_mismatch;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  int i;
  int tl;
  HasNewFatalFailureHelper gtest_fatal_failure_checker;
  int bitrate_sl2;
  int bitrate_sl1;
  int bitrate_sl0;
  int bitrate_array [2];
  I420VideoSource video;
  int num_frames;
  undefined4 uVar4;
  undefined4 in_stack_fffffffffffffe2c;
  int iVar5;
  undefined4 in_stack_fffffffffffffe34;
  double *in_stack_fffffffffffffe38;
  char *in_stack_fffffffffffffe40;
  char *in_stack_fffffffffffffe48;
  int iVar6;
  Message *in_stack_fffffffffffffe50;
  string *in_stack_fffffffffffffe58;
  Type TVar7;
  HasNewFatalFailureHelper *in_stack_fffffffffffffe60;
  uint in_stack_fffffffffffffe70;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb4;
  AssertionResult local_130 [2];
  double local_110;
  AssertionResult local_108;
  int local_f8;
  int local_f4;
  uint local_dc;
  HasNewFatalFailureHelper local_d8;
  uint local_bc;
  uint local_b8;
  uint local_b4;
  uint local_b0 [7];
  allocator local_91;
  string local_90 [32];
  undefined1 local_70 [100];
  int local_c;
  
  (in_RDI->super_DatarateTest).super_EncoderTest.cfg_.rc_buf_initial_sz = 500;
  (in_RDI->super_DatarateTest).super_EncoderTest.cfg_.rc_buf_optimal_sz = 500;
  (in_RDI->super_DatarateTest).super_EncoderTest.cfg_.rc_buf_sz = 1000;
  (in_RDI->super_DatarateTest).super_EncoderTest.cfg_.rc_dropframe_thresh = 0;
  (in_RDI->super_DatarateTest).super_EncoderTest.cfg_.rc_min_quantizer = 0;
  (in_RDI->super_DatarateTest).super_EncoderTest.cfg_.rc_max_quantizer = 0x38;
  (in_RDI->super_DatarateTest).super_EncoderTest.cfg_.rc_end_usage = AOM_CBR;
  (in_RDI->super_DatarateTest).super_EncoderTest.cfg_.g_lag_in_frames = 0;
  (in_RDI->super_DatarateTest).super_EncoderTest.cfg_.g_error_resilient = 0;
  (in_RDI->super_DatarateTest).super_EncoderTest.cfg_.kf_max_dist = 0x96;
  (in_RDI->super_DatarateTest).super_EncoderTest.cfg_.kf_min_dist = 0x96;
  local_c = 300;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,"hantro_collage_w352h288.yuv",&local_91);
  uVar4 = 0;
  iVar5 = local_c;
  libaom_test::I420VideoSource::I420VideoSource
            ((I420VideoSource *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
             (uint)((ulong)in_stack_fffffffffffffe50 >> 0x20),(uint)in_stack_fffffffffffffe50,
             (int)((ulong)in_stack_fffffffffffffe48 >> 0x20),(int)in_stack_fffffffffffffe48,
             in_stack_fffffffffffffe70,(int)in_RDI);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  local_b0[0] = 500;
  local_b0[1] = 1000;
  testing::
  WithParamInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_unsigned_int,_int>_>
  ::GetParam();
  p_Var3 = std::get<4ul,libaom_test::CodecFactory_const*,libaom_test::TestMode,int,unsigned_int,int>
                     ((tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_unsigned_int,_int>
                       *)0x7cd8bb);
  (in_RDI->super_DatarateTest).super_EncoderTest.cfg_.rc_target_bitrate = local_b0[*p_Var3];
  (*(in_RDI->super_CodecTestWith4Params<libaom_test::TestMode,_int,_unsigned_int,_int>).
    super_TestWithParam<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_unsigned_int,_int>_>
    .super_Test._vptr_Test[8])();
  in_RDI->simulcast_mode_ = 1;
  in_RDI->frame_to_start_decoding_ = (in_RDI->super_DatarateTest).super_EncoderTest.cfg_.kf_max_dist
  ;
  in_RDI->layer_to_decode_ = 2;
  in_RDI->number_temporal_layers_ = 3;
  in_RDI->number_spatial_layers_ = 3;
  local_b4 = (in_RDI->super_DatarateTest).super_EncoderTest.cfg_.rc_target_bitrate >> 3;
  in_RDI->target_layer_bitrate_[0] = (int)(local_b4 * 0x32) / 100;
  in_RDI->target_layer_bitrate_[1] = (int)(local_b4 * 0x46) / 100;
  in_RDI->target_layer_bitrate_[2] = local_b4;
  local_b8 = (in_RDI->super_DatarateTest).super_EncoderTest.cfg_.rc_target_bitrate * 3 >> 3;
  in_RDI->target_layer_bitrate_[3] = (int)(local_b8 * 0x32) / 100;
  in_RDI->target_layer_bitrate_[4] = (int)(local_b8 * 0x46) / 100;
  in_RDI->target_layer_bitrate_[5] = local_b8;
  local_bc = (in_RDI->super_DatarateTest).super_EncoderTest.cfg_.rc_target_bitrate >> 1 & 0x1fffffff
  ;
  in_RDI->target_layer_bitrate_[6] = (int)(local_bc * 0x32) / 100;
  in_RDI->target_layer_bitrate_[7] = (int)(local_bc * 0x46) / 100;
  in_RDI->target_layer_bitrate_[8] = local_bc;
  bVar1 = testing::internal::AlwaysTrue();
  TVar7 = (Type)((ulong)in_stack_fffffffffffffe58 >> 0x20);
  if (bVar1) {
    testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper(in_stack_fffffffffffffe60)
    ;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      (*(in_RDI->super_DatarateTest).super_EncoderTest._vptr_EncoderTest[2])
                (&in_RDI->super_DatarateTest,local_70);
    }
    bVar1 = testing::internal::HasNewFatalFailureHelper::has_new_fatal_failure(&local_d8);
    if (bVar1) {
      local_dc = 2;
    }
    else {
      local_dc = 0;
    }
    testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper
              ((HasNewFatalFailureHelper *)CONCAT44(in_stack_fffffffffffffe34,iVar5));
    TVar7 = (Type)((ulong)in_stack_fffffffffffffe58 >> 0x20);
    if (local_dc == 0) {
      for (local_f4 = 0; TVar7 = (Type)((ulong)in_stack_fffffffffffffe58 >> 0x20),
          local_f4 < in_RDI->number_temporal_layers_; local_f4 = local_f4 + 1) {
        local_f8 = in_RDI->layer_to_decode_ * in_RDI->number_temporal_layers_ + local_f4;
        local_110 = (double)in_RDI->target_layer_bitrate_[local_f8] * 0.6;
        testing::internal::CmpHelperGE<double,double>
                  (in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,
                   (double *)CONCAT44(in_stack_fffffffffffffe34,iVar5));
        bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_108);
        if (!bVar1) {
          testing::Message::Message((Message *)in_stack_fffffffffffffe60);
          in_stack_fffffffffffffe60 =
               (HasNewFatalFailureHelper *)
               testing::Message::operator<<
                         ((Message *)CONCAT44(in_stack_fffffffffffffe34,iVar5),
                          (char (*) [61])CONCAT44(in_stack_fffffffffffffe2c,uVar4));
          in_stack_fffffffffffffe58 =
               (string *)testing::AssertionResult::failure_message((AssertionResult *)0x7cdd54);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)in_stack_fffffffffffffe60,
                     (Type)((ulong)in_stack_fffffffffffffe58 >> 0x20),
                     (char *)in_stack_fffffffffffffe50,
                     (int)((ulong)in_stack_fffffffffffffe48 >> 0x20),in_stack_fffffffffffffe40);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                     (Message *)in_stack_fffffffffffffea8._M_head_impl);
          testing::internal::AssertHelper::~AssertHelper
                    ((AssertHelper *)CONCAT44(in_stack_fffffffffffffe34,iVar5));
          testing::Message::~Message((Message *)0x7cddae);
        }
        local_dc = (uint)!bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x7cde35);
        if (local_dc != 0) goto LAB_007ce14b;
        testing::internal::CmpHelperLE<double,double>
                  (in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,
                   (double *)CONCAT44(in_stack_fffffffffffffe34,iVar5));
        bVar1 = testing::AssertionResult::operator_cast_to_bool(local_130);
        if (!bVar1) {
          testing::Message::Message((Message *)in_stack_fffffffffffffe60);
          in_stack_fffffffffffffe50 =
               testing::Message::operator<<
                         ((Message *)CONCAT44(in_stack_fffffffffffffe34,iVar5),
                          (char (*) [63])CONCAT44(in_stack_fffffffffffffe2c,uVar4));
          in_stack_fffffffffffffe48 =
               testing::AssertionResult::failure_message((AssertionResult *)0x7cdeff);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)in_stack_fffffffffffffe60,
                     (Type)((ulong)in_stack_fffffffffffffe58 >> 0x20),
                     (char *)in_stack_fffffffffffffe50,
                     (int)((ulong)in_stack_fffffffffffffe48 >> 0x20),in_stack_fffffffffffffe40);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                     (Message *)in_stack_fffffffffffffea8._M_head_impl);
          testing::internal::AssertHelper::~AssertHelper
                    ((AssertHelper *)CONCAT44(in_stack_fffffffffffffe34,iVar5));
          testing::Message::~Message((Message *)0x7cdf59);
        }
        local_dc = (uint)!bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x7cdfdd);
        if (local_dc != 0) goto LAB_007ce14b;
      }
      uVar2 = local_c - in_RDI->frame_to_start_decoding_ >> 1;
      GetMismatchFrames(in_RDI);
      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                (in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,
                 (int *)in_stack_fffffffffffffe38,(int *)CONCAT44(in_stack_fffffffffffffe34,iVar5));
      iVar6 = (int)((ulong)in_stack_fffffffffffffe48 >> 0x20);
      bVar1 = testing::AssertionResult::operator_cast_to_bool
                        ((AssertionResult *)&stack0xfffffffffffffea0);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffe60);
        message = testing::AssertionResult::failure_message((AssertionResult *)0x7ce090);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)in_stack_fffffffffffffe60,TVar7,(char *)in_stack_fffffffffffffe50
                   ,iVar6,message);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)CONCAT44(uVar2,in_stack_fffffffffffffeb0),
                   (Message *)in_stack_fffffffffffffea8._M_head_impl);
        testing::internal::AssertHelper::~AssertHelper
                  ((AssertHelper *)CONCAT44(in_stack_fffffffffffffe34,iVar5));
        testing::Message::~Message((Message *)0x7ce0de);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x7ce140);
      local_dc = 0;
      goto LAB_007ce14b;
    }
    if (local_dc != 2) goto LAB_007ce14b;
  }
  iVar6 = (int)((ulong)in_stack_fffffffffffffe48 >> 0x20);
  testing::Message::Message((Message *)in_stack_fffffffffffffe60);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)in_stack_fffffffffffffe60,TVar7,(char *)in_stack_fffffffffffffe50,iVar6
             ,in_stack_fffffffffffffe40);
  testing::internal::AssertHelper::operator=
            ((AssertHelper *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
             (Message *)in_stack_fffffffffffffea8._M_head_impl);
  testing::internal::AssertHelper::~AssertHelper
            ((AssertHelper *)CONCAT44(in_stack_fffffffffffffe34,iVar5));
  testing::Message::~Message((Message *)0x7cdc12);
  local_dc = 1;
LAB_007ce14b:
  libaom_test::I420VideoSource::~I420VideoSource((I420VideoSource *)0x7ce158);
  return;
}

Assistant:

virtual void BasicRateTargetingSVC3TL3SLSimulcast() {
    cfg_.rc_buf_initial_sz = 500;
    cfg_.rc_buf_optimal_sz = 500;
    cfg_.rc_buf_sz = 1000;
    cfg_.rc_dropframe_thresh = 0;
    cfg_.rc_min_quantizer = 0;
    cfg_.rc_max_quantizer = 56;
    cfg_.rc_end_usage = AOM_CBR;
    cfg_.g_lag_in_frames = 0;
    cfg_.g_error_resilient = 0;
    cfg_.kf_max_dist = 150;
    cfg_.kf_min_dist = 150;
    int num_frames = 300;
    ::libaom_test::I420VideoSource video("hantro_collage_w352h288.yuv", 352,
                                         288, 30, 1, 0, num_frames);
    const int bitrate_array[2] = { 500, 1000 };
    cfg_.rc_target_bitrate = bitrate_array[GET_PARAM(4)];
    ResetModel();
    simulcast_mode_ = 1;
    frame_to_start_decoding_ = cfg_.kf_max_dist;
    layer_to_decode_ = 2;  // SL2
    number_temporal_layers_ = 3;
    number_spatial_layers_ = 3;
    // SL0
    const int bitrate_sl0 = 1 * cfg_.rc_target_bitrate / 8;
    target_layer_bitrate_[0] = 50 * bitrate_sl0 / 100;
    target_layer_bitrate_[1] = 70 * bitrate_sl0 / 100;
    target_layer_bitrate_[2] = bitrate_sl0;
    // SL1
    const int bitrate_sl1 = 3 * cfg_.rc_target_bitrate / 8;
    target_layer_bitrate_[3] = 50 * bitrate_sl1 / 100;
    target_layer_bitrate_[4] = 70 * bitrate_sl1 / 100;
    target_layer_bitrate_[5] = bitrate_sl1;
    // SL2
    const int bitrate_sl2 = 4 * cfg_.rc_target_bitrate / 8;
    target_layer_bitrate_[6] = 50 * bitrate_sl2 / 100;
    target_layer_bitrate_[7] = 70 * bitrate_sl2 / 100;
    target_layer_bitrate_[8] = bitrate_sl2;
    ASSERT_NO_FATAL_FAILURE(RunLoop(&video));
    // Only SL2 layer is decoded.
    for (int tl = 0; tl < number_temporal_layers_; tl++) {
      int i = layer_to_decode_ * number_temporal_layers_ + tl;
      ASSERT_GE(effective_datarate_tl[i], target_layer_bitrate_[i] * 0.6)
          << " The datarate for the file is lower than target by too much!";
      ASSERT_LE(effective_datarate_tl[i], target_layer_bitrate_[i] * 1.7)
          << " The datarate for the file is greater than target by too much!";
    }
#if CONFIG_AV1_DECODER
    // Only top spatial layer (SL2) is decoded, starting at frame 150
    // (frame_to_start_decoding_), so there (300 - 150) / 2 = 75
    // non-reference frames, so mismatch is 75.
    int num_mismatch = (num_frames - frame_to_start_decoding_) / 2;
    EXPECT_EQ((int)GetMismatchFrames(), num_mismatch);
#endif
  }